

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobjectmanager.cpp
# Opt level: O1

PAL_ERROR __thiscall
CorUnix::CSharedMemoryObjectManager::AllocateObject
          (CSharedMemoryObjectManager *this,CPalThread *pthr,CObjectType *pot,CObjectAttributes *poa
          ,IPalObject **ppobjNew)

{
  PAL_ERROR PVar1;
  CSharedMemoryWaitableObject *pCVar2;
  
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","AllocateObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x99);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (pot == (CObjectType *)0x0) {
    fprintf(_stderr,"] %s %s:%d","AllocateObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x9a);
    fprintf(_stderr,"Expression: NULL != pot\n");
  }
  if (poa == (CObjectAttributes *)0x0) {
    fprintf(_stderr,"] %s %s:%d","AllocateObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x9b);
    fprintf(_stderr,"Expression: NULL != poa\n");
  }
  if (ppobjNew == (IPalObject **)0x0) {
    fprintf(_stderr,"] %s %s:%d","AllocateObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x9c);
    fprintf(_stderr,"Expression: NULL != ppobjNew\n");
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    if (pot->m_eSynchronizationSupport == WaitableObject) {
      pCVar2 = InternalNew<CorUnix::CSharedMemoryWaitableObject,CorUnix::CObjectType*,_CRITICAL_SECTION*>
                         (pot,&this->m_csListLock);
    }
    else {
      pCVar2 = (CSharedMemoryWaitableObject *)
               InternalNew<CorUnix::CSharedMemoryObject,CorUnix::CObjectType*,_CRITICAL_SECTION*>
                         (pot,&this->m_csListLock);
    }
    if (pCVar2 == (CSharedMemoryWaitableObject *)0x0) {
      PVar1 = 0xe;
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0013514c;
    }
    else {
      PVar1 = (*(pCVar2->super_CSharedMemoryObject).super_CPalObjectBase.super_IPalObject.
                _vptr_IPalObject[0xf])(pCVar2,pthr,poa);
      if (PVar1 == 0) {
        *ppobjNew = (IPalObject *)pCVar2;
      }
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      return PVar1;
    }
  }
LAB_0013514c:
  abort();
}

Assistant:

PAL_ERROR
CSharedMemoryObjectManager::AllocateObject(
    CPalThread *pthr,
    CObjectType *pot,
    CObjectAttributes *poa,
    IPalObject **ppobjNew            // OUT
    )
{
    PAL_ERROR palError = NO_ERROR;
    CSharedMemoryObject *pshmobj = NULL;

    _ASSERTE(NULL != pthr);
    _ASSERTE(NULL != pot);
    _ASSERTE(NULL != poa);
    _ASSERTE(NULL != ppobjNew);

    ENTRY("CSharedMemoryObjectManager::AllocateObject "
        "(this=%p, pthr=%p, pot=%p, poa=%p, ppobjNew=%p)\n",
        this,
        pthr,
        pot,
        poa,
        ppobjNew
        );

    if (CObjectType::WaitableObject == pot->GetSynchronizationSupport())
    {
        pshmobj = InternalNew<CSharedMemoryWaitableObject>(pot, &m_csListLock);
    }
    else
    {
        pshmobj = InternalNew<CSharedMemoryObject>(pot, &m_csListLock);
    }

    if (NULL != pshmobj)
    {
        palError = pshmobj->Initialize(pthr, poa);
        if (NO_ERROR == palError)
        {
            *ppobjNew = static_cast<IPalObject*>(pshmobj);
        }
    }
    else
    {
        ERROR("Unable to allocate pshmobj\n");
        palError = ERROR_OUTOFMEMORY;
    }

    LOGEXIT("CSharedMemoryObjectManager::AllocateObject returns %d\n", palError);
    return palError;
}